

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O0

int leveldb::test::RandomSeed(void)

{
  char *__nptr;
  int local_18;
  int local_14;
  int result;
  char *env;
  
  __nptr = getenv("TEST_RANDOM_SEED");
  if (__nptr == (char *)0x0) {
    local_18 = 0x12d;
  }
  else {
    local_18 = atoi(__nptr);
  }
  local_14 = local_18;
  if (local_18 < 1) {
    local_14 = 0x12d;
  }
  return local_14;
}

Assistant:

int RandomSeed() {
  const char* env = getenv("TEST_RANDOM_SEED");
  int result = (env != nullptr ? atoi(env) : 301);
  if (result <= 0) {
    result = 301;
  }
  return result;
}